

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::destroy(DefaultUnfoundedCheck *this,Solver *s,bool detach)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  AtomNode *this_00;
  byte in_DL;
  Solver *in_RSI;
  PrgDepGraph *in_RDI;
  BodyPtr BVar4;
  AtomNode *a;
  size_type end;
  size_type i_1;
  RemExtWatches remW;
  BodyPtr n;
  uint32 i;
  Solver *in_stack_ffffffffffffff78;
  Solver *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff8c;
  RemExtWatches *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  size_type sVar5;
  undefined4 in_stack_ffffffffffffffc0;
  Literal in_stack_ffffffffffffffc4;
  BodyNode *in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_type local_18;
  
  if ((in_RSI != (Solver *)0x0) && ((in_DL & 1) != 0)) {
    Solver::removePost(in_stack_ffffffffffffff80,(PostPropagator *)in_stack_ffffffffffffff78);
    local_18 = 0;
    while (in_stack_ffffffffffffff8c = local_18,
          sVar2 = bk_lib::
                  pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                  ::size((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                          *)&in_RDI->field_0x38), in_stack_ffffffffffffff8c != sVar2) {
      BVar4 = getBody((DefaultUnfoundedCheck *)in_stack_ffffffffffffff80,
                      (NodeId)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      in_stack_ffffffffffffffd0 = BVar4.id;
      in_stack_ffffffffffffff80 = in_RSI;
      in_stack_ffffffffffffffc8 = BVar4.node;
      in_stack_ffffffffffffffc4 = Literal::operator~((Literal *)in_stack_ffffffffffffff78);
      Solver::removeWatch((Solver *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (Literal *)in_stack_ffffffffffffffc8,
                          (Constraint *)
                          CONCAT44(in_stack_ffffffffffffffc4.rep_,in_stack_ffffffffffffffc0));
      bVar1 = Asp::PrgDepGraph::BodyNode::extended(BVar4.node);
      if (bVar1) {
        Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::RemExtWatches>
                  (in_RDI,(BodyNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0);
      }
      local_18 = local_18 + 1;
    }
    sVar5 = 0;
    sVar3 = bk_lib::
            pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
            ::size((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                    *)&(in_RDI->components_).ebo_.size);
    for (; sVar5 != sVar3; sVar5 = sVar5 + 1) {
      this_00 = Asp::PrgDepGraph::getAtom
                          ((PrgDepGraph *)in_stack_ffffffffffffff80,
                           (NodeId)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      bVar1 = Asp::PrgDepGraph::AtomNode::inChoice(this_00);
      if (bVar1) {
        in_stack_ffffffffffffff78 = in_RSI;
        Literal::operator~((Literal *)in_RSI);
        Solver::removeWatch((Solver *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (Literal *)in_stack_ffffffffffffffc8,
                            (Constraint *)
                            CONCAT44(in_stack_ffffffffffffffc4.rep_,in_stack_ffffffffffffffc0));
      }
    }
  }
  Constraint::destroy((Constraint *)in_RDI,
                      (Solver *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
  return;
}

Assistant:

void DefaultUnfoundedCheck::destroy(Solver* s, bool detach) {
	if (s && detach) {
		s->removePost(this);
		for (uint32 i = 0; i != (uint32)bodies_.size(); ++i) {
			BodyPtr n(getBody(i));
			s->removeWatch(~n.node->lit, this);
			if (n.node->extended()) {
				RemExtWatches remW = { static_cast<Constraint*>(this), s };
				graph_->visitBodyLiterals(*n.node, remW);
			}
		}
		for (AtomVec::size_type i = 0, end = atoms_.size(); i != end; ++i) {
			const AtomNode& a = graph_->getAtom(NodeId(i));
			if (a.inChoice()) { s->removeWatch(~a.lit, this); }
		}
	}
	PostPropagator::destroy(s, detach);
}